

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::SemaphoreTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SemaphoreTestInstance *this)

{
  deUint32 dVar1;
  long *plVar2;
  VkQueue pVVar3;
  PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  data;
  PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  data_00;
  RefData<vk::Handle<(vk::HandleType)4>_> data_01;
  undefined4 uVar4;
  pointer pQVar5;
  VkQueueFlags flagsWrite;
  VkQueueFlags flagsRead;
  uint uVar6;
  uint uVar7;
  VkResult VVar8;
  int iVar9;
  OperationContext *pOVar10;
  DeviceInterface *vk_00;
  MultiQueues *this_00;
  size_type sVar11;
  Resource *pRVar12;
  Resource *pRVar13;
  const_reference pvVar14;
  Handle<(vk::HandleType)24> *pHVar15;
  VkCommandBuffer_s **ppVVar16;
  Operation *pOVar17;
  VkAccessFlags extraout_var;
  VkAccessFlags extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t extraout_RDX;
  void *b;
  MovePtr *this_01;
  deUint32 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  VkSharingMode in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  VkAllocationCallbacks **local_590;
  VkCommandPool *local_578;
  allocator<char> local_371;
  string local_370;
  uint local_350;
  allocator<char> local_349;
  string local_348;
  undefined8 local_328;
  Data actual;
  Data expected;
  Handle<(vk::HandleType)6> local_300;
  SyncInfo local_2f8;
  undefined1 local_2e8 [8];
  SyncInfo readSync;
  undefined1 local_2c8 [8];
  SyncInfo writeSync;
  VkSubmitInfo submitInfo [2];
  undefined1 local_21c [8];
  VkPipelineStageFlags stageBits [1];
  RefData<vk::Handle<(vk::HandleType)4>_> local_1f8;
  undefined1 local_1d8 [8];
  Unique<vk::Handle<(vk::HandleType)4>_> semaphore;
  VkCommandBuffer cmdBuffers [2];
  undefined1 local_188 [8];
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  undefined1 local_138 [8];
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  local_f0;
  PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_e0;
  undefined1 local_d0 [8];
  UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  readOp;
  undefined1 local_a0 [8];
  UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  writeOp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88 [2];
  undefined1 local_58 [8];
  UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  resource;
  undefined1 local_40 [4];
  deUint32 pairNdx;
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  queuePairs;
  VkDevice device;
  DeviceInterface *vk;
  SemaphoreTestInstance_conflict *this_local;
  
  pOVar10 = de::details::
            UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
            ::operator->((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                          *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  vk_00 = OperationContext::getDeviceInterface(pOVar10);
  pOVar10 = de::details::
            UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
            ::operator->((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                          *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  queuePairs.
  super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)OperationContext::getDevice(pOVar10)
  ;
  this_00 = de::details::
            UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
            ::operator->((UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                          *)&(this->super_BaseTestInstance).m_opContext);
  pRVar12 = (this->super_BaseTestInstance).m_resource.
            super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
            .m_data.ptr;
  pOVar10 = de::details::
            UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
            ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                         *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  flagsWrite = (**(code **)(*(long *)pRVar12 + 0x18))(pRVar12,pOVar10);
  plVar2 = *(long **)&(this->super_BaseTestInstance).m_resource.
                      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                      .m_data.field_0x8;
  pOVar10 = de::details::
            UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
            ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                         *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  flagsRead = (**(code **)(*plVar2 + 0x18))(plVar2,pOVar10);
  MultiQueues::getQueuesPairs
            ((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              *)local_40,this_00,flagsWrite,flagsRead);
  for (resource.
       super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
       .m_data._12_4_ = 0;
      uVar4 = resource.
              super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              .m_data._12_4_,
      sVar11 = std::
               vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
               ::size((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                       *)local_40), (uint)uVar4 < (uint)sVar11;
      resource.
      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
      .m_data._12_4_ =
           resource.
           super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
           .m_data._12_4_ + 1) {
    pRVar12 = (Resource *)operator_new(0x80);
    writeOp.
    super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    .m_data._15_1_ = 1;
    pOVar10 = de::details::
              UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
              ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                           *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
    uVar6 = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                  super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                  .m_data.ptr + 0x10))();
    uVar7 = (**(code **)(**(long **)&(this->super_BaseTestInstance).m_resource.
                                     super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                     .m_data.field_0x8 + 0x10))();
    local_88[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_88);
    Resource::Resource(pRVar12,pOVar10,
                       (ResourceDescription *)
                       &(this->super_BaseTestInstance).m_opContext.m_allocator,uVar6 | uVar7,
                       VK_SHARING_MODE_EXCLUSIVE,local_88);
    writeOp.
    super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    .m_data._15_1_ = 0;
    de::DefaultDeleter<vkt::synchronization::Resource>::DefaultDeleter
              ((DefaultDeleter<vkt::synchronization::Resource> *)
               &writeOp.
                super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                .m_data.field_0xe);
    de::details::
    UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>::
    UniquePtr((UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               *)local_58,pRVar12);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(local_88);
    pRVar12 = (this->super_BaseTestInstance).m_resource.
              super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              .m_data.ptr;
    pOVar10 = de::details::
              UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
              ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                           *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
    pRVar13 = de::details::
              UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              ::operator*((UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                           *)local_58);
    (**(code **)(*(long *)pRVar12 + 0x28))
              (&readOp.
                super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                .m_data.field_0x8,pRVar12,pOVar10,pRVar13);
    de::details::MovePtr::operator_cast_to_PtrData
              ((PtrData<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                *)&readOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   .m_data.field_0x8,(MovePtr *)pRVar12);
    data.ptr._4_4_ = in_stack_fffffffffffffa0c;
    data.ptr._0_4_ = in_stack_fffffffffffffa08;
    data._8_4_ = in_stack_fffffffffffffa10;
    data._12_4_ = in_stack_fffffffffffffa14;
    de::details::
    UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::UniquePtr((UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 *)local_a0,data);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    ~MovePtr((MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              *)&readOp.
                 super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 .m_data.field_0x8);
    this_01 = *(MovePtr **)
               &(this->super_BaseTestInstance).m_resource.
                super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                .m_data.field_0x8;
    pOVar10 = de::details::
              UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
              ::operator*((UniqueBase<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
                           *)&(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
    pRVar12 = de::details::
              UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              ::operator*((UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                           *)local_58);
    (**(code **)(*(long *)this_01 + 0x28))(&local_f0,this_01,pOVar10,pRVar12);
    local_e0 = de::details::MovePtr::operator_cast_to_PtrData(&local_f0,this_01);
    data_00.ptr._4_4_ = in_stack_fffffffffffffa0c;
    data_00.ptr._0_4_ = in_stack_fffffffffffffa08;
    data_00._8_4_ = in_stack_fffffffffffffa10;
    data_00._12_4_ = in_stack_fffffffffffffa14;
    de::details::
    UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::UniquePtr((UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 *)local_d0,data_00);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    ~MovePtr((MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              *)&local_f0);
    pQVar5 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_138,vk_00,(VkDevice)pQVar5,2,
               pvVar14->familyIndexWrite,(VkAllocationCallbacks *)0x0);
    pQVar5 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
               ,vk_00,(VkDevice)pQVar5,2,pvVar14->familyIndexRead,(VkAllocationCallbacks *)0x0);
    pQVar5 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_138);
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)local_188,vk_00,(VkDevice)pQVar5,
                      (VkCommandPool)pHVar15->m_internal);
    pQVar5 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                         &cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                          m_allocator);
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)
                      &ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                      vk_00,(VkDevice)pQVar5,(VkCommandPool)pHVar15->m_internal);
    ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_188);
    semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)*ppVVar16;
    ppVVar16 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)
                          &ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                           m_pool);
    cmdBuffers[0] = *ppVVar16;
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)(local_21c + 4),vk_00,
               (VkDevice)
               queuePairs.
               super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,0,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f8,(Move *)(local_21c + 4));
    in_stack_fffffffffffffa0c = (undefined4)(local_1f8.object.m_internal >> 0x20);
    in_stack_fffffffffffffa14 = (undefined4)((ulong)local_1f8.deleter.m_deviceIface >> 0x20);
    data_01.deleter.m_deviceIface._0_4_ = (int)local_1f8.deleter.m_deviceIface;
    data_01.object.m_internal = local_1f8.object.m_internal;
    data_01.deleter.m_deviceIface._4_4_ = in_stack_fffffffffffffa14;
    data_01.deleter.m_device._0_4_ = (int)local_1f8.deleter.m_device;
    data_01.deleter.m_device._4_4_ = (int)((ulong)local_1f8.deleter.m_device >> 0x20);
    data_01.deleter.m_allocator = local_1f8.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_1d8,data_01);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)4>_> *)(local_21c + 4));
    local_21c._0_4_ = 1;
    writeSync.imageLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL;
    submitInfo[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo[0]._4_4_ = 0;
    submitInfo[0].pNext._0_4_ = 0;
    submitInfo[0].waitSemaphoreCount = 0;
    submitInfo[0]._20_4_ = 0;
    submitInfo[0].pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfo[0].pWaitDstStageMask._0_4_ = 1;
    submitInfo[0]._40_8_ =
         &semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
    submitInfo[0].pCommandBuffers._0_4_ = 1;
    submitInfo[0]._56_8_ =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_1d8);
    submitInfo[0].pSignalSemaphores._0_4_ = 4;
    submitInfo[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo[1]._4_4_ = 0;
    submitInfo[1].pNext._0_4_ = 1;
    submitInfo[1]._16_8_ =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_1d8);
    submitInfo[1].pWaitSemaphores = (VkSemaphore *)local_21c;
    submitInfo[1].pWaitDstStageMask._0_4_ = 1;
    submitInfo[1]._40_8_ = cmdBuffers;
    submitInfo[1].pCommandBuffers._0_4_ = 0;
    submitInfo[1].signalSemaphoreCount = 0;
    submitInfo[1]._60_4_ = 0;
    pOVar17 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_a0);
    readSync.imageLayout = (*pOVar17->_vptr_Operation[3])();
    register0x00000004 = extraout_var;
    local_2c8 = (undefined1  [8])register0x00000000;
    pOVar17 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_d0);
    local_2f8.stageMask = (*pOVar17->_vptr_Operation[3])();
    local_2f8.accessMask = extraout_var_00;
    local_2e8 = (undefined1  [8])local_2f8._0_8_;
    beginCommandBuffer(vk_00,(VkCommandBuffer)
                             semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                             m_allocator);
    pOVar17 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_a0);
    (*pOVar17->_vptr_Operation[2])
              (pOVar17,semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                       m_allocator);
    pRVar12 = de::details::
              UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              ::operator*((UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                           *)local_58);
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    dVar1 = pvVar14->familyIndexWrite;
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    createBarrierMultiQueue
              (vk_00,(VkCommandBuffer *)
                     &semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                      m_allocator,(SyncInfo *)local_2c8,(SyncInfo *)local_2e8,pRVar12,dVar1,
               pvVar14->familyIndexRead,
               *(VkSharingMode *)
                &(this->super_BaseTestInstance).m_writeOp.
                 super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 .m_data.ptr,false);
    endCommandBuffer(vk_00,(VkCommandBuffer)
                           semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                           m_allocator);
    beginCommandBuffer(vk_00,cmdBuffers[0]);
    pRVar12 = de::details::
              UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              ::operator*((UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                           *)local_58);
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    dVar1 = pvVar14->familyIndexWrite;
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    in_stack_fffffffffffffa08 = pvVar14->familyIndexRead;
    in_stack_fffffffffffffa10 =
         *(VkSharingMode *)
          &(this->super_BaseTestInstance).m_writeOp.
           super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           .m_data.ptr;
    createBarrierMultiQueue
              (vk_00,cmdBuffers,(SyncInfo *)local_2c8,(SyncInfo *)local_2e8,pRVar12,dVar1,
               in_stack_fffffffffffffa08,in_stack_fffffffffffffa10,true);
    pOVar17 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_d0);
    (*pOVar17->_vptr_Operation[2])(pOVar17,cmdBuffers[0]);
    endCommandBuffer(vk_00,cmdBuffers[0]);
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    pVVar3 = pvVar14->queueWrite;
    ::vk::Handle<(vk::HandleType)6>::Handle(&local_300,0);
    VVar8 = (*vk_00->_vptr_DeviceInterface[2])
                      (vk_00,pVVar3,1,&writeSync.imageLayout,local_300.m_internal);
    ::vk::checkResult(VVar8,
                      "vk.queueSubmit(queuePairs[pairNdx].queueWrite, 1u, &submitInfo[QUEUETYPE_WRITE], DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                      ,0x177);
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    pVVar3 = pvVar14->queueRead;
    ::vk::Handle<(vk::HandleType)6>::Handle((Handle<(vk::HandleType)6> *)&expected.data,0);
    VVar8 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,&submitInfo[0].pSignalSemaphores);
    ::vk::checkResult(VVar8,
                      "vk.queueSubmit(queuePairs[pairNdx].queueRead, 1u, &submitInfo[QUEUETYPE_READ], DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                      ,0x178);
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    VVar8 = (*vk_00->_vptr_DeviceInterface[3])(vk_00,pvVar14->queueWrite);
    ::vk::checkResult(VVar8,"vk.queueWaitIdle(queuePairs[pairNdx].queueWrite)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                      ,0x179);
    pvVar14 = std::
              vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
              ::operator[]((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                            *)local_40,
                           (ulong)(uint)resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data._12_4_);
    VVar8 = (*vk_00->_vptr_DeviceInterface[3])(vk_00,pvVar14->queueRead);
    ::vk::checkResult(VVar8,"vk.queueWaitIdle(queuePairs[pairNdx].queueRead)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                      ,0x17a);
    pOVar17 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_a0);
    iVar9 = (*pOVar17->_vptr_Operation[4])();
    actual.data = (deUint8 *)CONCAT44(extraout_var_01,iVar9);
    expected.size = extraout_RDX;
    pOVar17 = de::details::
              UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              ::operator->((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                            *)local_d0);
    iVar9 = (*pOVar17->_vptr_Operation[4])();
    local_328 = CONCAT44(extraout_var_02,iVar9);
    iVar9 = deMemCmp((void *)expected.size,b,(size_t)actual.data);
    if (iVar9 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"Memory contents don\'t match",&local_349);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
    }
    local_350 = (uint)(iVar9 != 0);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_1d8);
    local_578 = &ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
    do {
      local_578 = local_578 + -4;
      ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
                ((Move<vk::VkCommandBuffer_s_*> *)local_578);
    } while (local_578 != (VkCommandPool *)local_188);
    local_590 = &cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_allocator;
    do {
      local_590 = local_590 + -4;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)24>_> *)local_590);
    } while (local_590 != (VkAllocationCallbacks **)local_138);
    de::details::
    UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniquePtr((UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                  *)local_d0);
    de::details::
    UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniquePtr((UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                  *)local_a0);
    de::details::
    UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>::
    ~UniquePtr((UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                *)local_58);
    if (local_350 != 0) goto LAB_00e45a94;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"OK",&local_371);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  local_350 = 1;
LAB_00e45a94:
  std::
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  ::~vector((vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate (void)
	{
		enum {WRITE=0, READ, COUNT};
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkSemaphore>		semaphore			(createSemaphore (vk, device));
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
		VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[WRITE], *ptrCmdBuffer[READ]};
		const VkPipelineStageFlags		stageBits[]			= { VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT };
		const VkSubmitInfo				submitInfo[2]		=
															{
																{
																	VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType			sType;
																	DE_NULL,							// const void*				pNext;
																	0u,									// deUint32					waitSemaphoreCount;
																	DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
																	(const VkPipelineStageFlags*)DE_NULL,
																	1u,									// deUint32					commandBufferCount;
																	&cmdBuffers[WRITE],					// const VkCommandBuffer*	pCommandBuffers;
																	1u,									// deUint32					signalSemaphoreCount;
																	&semaphore.get(),					// const VkSemaphore*		pSignalSemaphores;
																},
																{
																	VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType				sType;
																	DE_NULL,							// const void*					pNext;
																	1u,									// deUint32						waitSemaphoreCount;
																	&semaphore.get(),					// const VkSemaphore*			pWaitSemaphores;
																	stageBits,							// const VkPipelineStageFlags*	pWaitDstStageMask;
																	1u,									// deUint32						commandBufferCount;
																	&cmdBuffers[READ],					// const VkCommandBuffer*		pCommandBuffers;
																	0u,									// deUint32						signalSemaphoreCount;
																	DE_NULL,							// const VkSemaphore*			pSignalSemaphores;
																}
															};
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, cmdBuffers[WRITE]);

		m_writeOp->recordCommands(cmdBuffers[WRITE]);

		if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffers[WRITE],  writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}

		endCommandBuffer(vk, cmdBuffers[WRITE]);

		beginCommandBuffer(vk, cmdBuffers[READ]);

		m_readOp->recordCommands(cmdBuffers[READ]);

		endCommandBuffer(vk, cmdBuffers[READ]);

		VK_CHECK(vk.queueSubmit(queue, 2u, submitInfo, DE_NULL));
		VK_CHECK(vk.queueWaitIdle(queue));

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}